

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerMovepage(Pager *pPager,DbPage *pPg,Pgno pgno,int isCommit)

{
  int iVar1;
  DbPage *pDVar2;
  int in_ECX;
  int in_EDX;
  DbPage **in_RSI;
  long in_RDI;
  PgHdr *pPgHdr;
  Pgno origPgno;
  int rc;
  Pgno needSyncPgno;
  PgHdr *pPgOld;
  undefined4 in_stack_ffffffffffffffb8;
  Pgno in_stack_ffffffffffffffbc;
  Pager *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint uVar3;
  u32 i;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  uVar3 = 0;
  if (((*(char *)(in_RDI + 0x13) == '\0') ||
      (iVar1 = sqlite3PagerWrite((PgHdr *)CONCAT44(in_stack_ffffffffffffffbc,
                                                   in_stack_ffffffffffffffb8)), iVar1 == 0)) &&
     (((*(ushort *)((long)in_RSI + 0x2c) & 2) == 0 ||
      ((iVar1 = subjRequiresPage((PgHdr *)CONCAT44(in_stack_ffffffffffffffcc,
                                                   in_stack_ffffffffffffffc8)), iVar1 == 0 ||
       (iVar1 = subjournalPage((PgHdr *)CONCAT44(in_EDX,in_ECX)), iVar1 == 0)))))) {
    if (((*(ushort *)((long)in_RSI + 0x2c) & 4) != 0) && (in_ECX == 0)) {
      uVar3 = *(uint *)(in_RSI + 5);
    }
    *(ushort *)((long)in_RSI + 0x2c) = *(ushort *)((long)in_RSI + 0x2c) & 0xfffb;
    pDVar2 = sqlite3PagerLookup(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    if (pDVar2 != (DbPage *)0x0) {
      *(ushort *)((long)in_RSI + 0x2c) = *(ushort *)((long)in_RSI + 0x2c) | pDVar2->flags & 4;
      if (*(char *)(in_RDI + 0x13) == '\0') {
        sqlite3PcacheDrop((PgHdr *)0x137fe6);
      }
      else {
        sqlite3PcacheMove((PgHdr *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      }
    }
    i = (u32)((ulong)pDVar2 >> 0x20);
    sqlite3PcacheMove((PgHdr *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    sqlite3PcacheMakeDirty((PgHdr *)0x13800c);
    if (*(char *)(in_RDI + 0x13) != '\0') {
      sqlite3PcacheMove((PgHdr *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      sqlite3PagerUnrefNotNull((DbPage *)in_stack_ffffffffffffffc0);
    }
    if (uVar3 != 0) {
      iVar1 = sqlite3PagerAcquire((Pager *)CONCAT44(in_stack_fffffffffffffffc,
                                                    in_stack_fffffffffffffff8),
                                  (Pgno)((ulong)in_RDI >> 0x20),in_RSI,in_EDX);
      if (iVar1 != 0) {
        if (*(uint *)(in_RDI + 0x20) < uVar3) {
          return iVar1;
        }
        sqlite3BitvecClear((Bitvec *)CONCAT44(in_EDX,in_ECX),i,(void *)CONCAT44(uVar3,iVar1));
        return iVar1;
      }
      *(ushort *)&in_stack_ffffffffffffffc0->errCode =
           (ushort)in_stack_ffffffffffffffc0->errCode | 4;
      sqlite3PcacheMakeDirty((PgHdr *)0x1380a6);
      sqlite3PagerUnrefNotNull((DbPage *)in_stack_ffffffffffffffc0);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerMovepage(Pager *pPager, DbPage *pPg, Pgno pgno, int isCommit){
  PgHdr *pPgOld;               /* The page being overwritten. */
  Pgno needSyncPgno = 0;       /* Old value of pPg->pgno, if sync is required */
  int rc;                      /* Return code */
  Pgno origPgno;               /* The original page number */

  assert( pPg->nRef>0 );
  assert( pPager->eState==PAGER_WRITER_CACHEMOD
       || pPager->eState==PAGER_WRITER_DBMOD
  );
  assert( assert_pager_state(pPager) );

  /* In order to be able to rollback, an in-memory database must journal
  ** the page we are moving from.
  */
  if( MEMDB ){
    rc = sqlite3PagerWrite(pPg);
    if( rc ) return rc;
  }

  /* If the page being moved is dirty and has not been saved by the latest
  ** savepoint, then save the current contents of the page into the 
  ** sub-journal now. This is required to handle the following scenario:
  **
  **   BEGIN;
  **     <journal page X, then modify it in memory>
  **     SAVEPOINT one;
  **       <Move page X to location Y>
  **     ROLLBACK TO one;
  **
  ** If page X were not written to the sub-journal here, it would not
  ** be possible to restore its contents when the "ROLLBACK TO one"
  ** statement were is processed.
  **
  ** subjournalPage() may need to allocate space to store pPg->pgno into
  ** one or more savepoint bitvecs. This is the reason this function
  ** may return SQLITE_NOMEM.
  */
  if( pPg->flags&PGHDR_DIRTY
   && subjRequiresPage(pPg)
   && SQLITE_OK!=(rc = subjournalPage(pPg))
  ){
    return rc;
  }

  PAGERTRACE(("MOVE %d page %d (needSync=%d) moves to %d\n", 
      PAGERID(pPager), pPg->pgno, (pPg->flags&PGHDR_NEED_SYNC)?1:0, pgno));
  IOTRACE(("MOVE %p %d %d\n", pPager, pPg->pgno, pgno))

  /* If the journal needs to be sync()ed before page pPg->pgno can
  ** be written to, store pPg->pgno in local variable needSyncPgno.
  **
  ** If the isCommit flag is set, there is no need to remember that
  ** the journal needs to be sync()ed before database page pPg->pgno 
  ** can be written to. The caller has already promised not to write to it.
  */
  if( (pPg->flags&PGHDR_NEED_SYNC) && !isCommit ){
    needSyncPgno = pPg->pgno;
    assert( pPager->journalMode==PAGER_JOURNALMODE_OFF ||
            pageInJournal(pPager, pPg) || pPg->pgno>pPager->dbOrigSize );
    assert( pPg->flags&PGHDR_DIRTY );
  }

  /* If the cache contains a page with page-number pgno, remove it
  ** from its hash chain. Also, if the PGHDR_NEED_SYNC flag was set for 
  ** page pgno before the 'move' operation, it needs to be retained 
  ** for the page moved there.
  */
  pPg->flags &= ~PGHDR_NEED_SYNC;
  pPgOld = sqlite3PagerLookup(pPager, pgno);
  assert( !pPgOld || pPgOld->nRef==1 );
  if( pPgOld ){
    pPg->flags |= (pPgOld->flags&PGHDR_NEED_SYNC);
    if( MEMDB ){
      /* Do not discard pages from an in-memory database since we might
      ** need to rollback later.  Just move the page out of the way. */
      sqlite3PcacheMove(pPgOld, pPager->dbSize+1);
    }else{
      sqlite3PcacheDrop(pPgOld);
    }
  }

  origPgno = pPg->pgno;
  sqlite3PcacheMove(pPg, pgno);
  sqlite3PcacheMakeDirty(pPg);

  /* For an in-memory database, make sure the original page continues
  ** to exist, in case the transaction needs to roll back.  Use pPgOld
  ** as the original page since it has already been allocated.
  */
  if( MEMDB ){
    assert( pPgOld );
    sqlite3PcacheMove(pPgOld, origPgno);
    sqlite3PagerUnrefNotNull(pPgOld);
  }

  if( needSyncPgno ){
    /* If needSyncPgno is non-zero, then the journal file needs to be 
    ** sync()ed before any data is written to database file page needSyncPgno.
    ** Currently, no such page exists in the page-cache and the 
    ** "is journaled" bitvec flag has been set. This needs to be remedied by
    ** loading the page into the pager-cache and setting the PGHDR_NEED_SYNC
    ** flag.
    **
    ** If the attempt to load the page into the page-cache fails, (due
    ** to a malloc() or IO failure), clear the bit in the pInJournal[]
    ** array. Otherwise, if the page is loaded and written again in
    ** this transaction, it may be written to the database file before
    ** it is synced into the journal file. This way, it may end up in
    ** the journal file twice, but that is not a problem.
    */
    PgHdr *pPgHdr;
    rc = sqlite3PagerGet(pPager, needSyncPgno, &pPgHdr);
    if( rc!=SQLITE_OK ){
      if( needSyncPgno<=pPager->dbOrigSize ){
        assert( pPager->pTmpSpace!=0 );
        sqlite3BitvecClear(pPager->pInJournal, needSyncPgno, pPager->pTmpSpace);
      }
      return rc;
    }
    pPgHdr->flags |= PGHDR_NEED_SYNC;
    sqlite3PcacheMakeDirty(pPgHdr);
    sqlite3PagerUnrefNotNull(pPgHdr);
  }

  return SQLITE_OK;
}